

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar3;
  uint uVar4;
  double *pdVar5;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  value_type vVar12;
  double dVar13;
  double dVar14;
  
  pFVar6 = (fadexpr->fadexpr_).left_;
  uVar4 = (pFVar6->fadexpr_).expr_.dx_.num_elts;
  uVar1 = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_01427975;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_01427975;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar6 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar7 = (ulong)uVar1 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar7);
    (this->dx_).ptr_to_data = pdVar5;
    uVar4 = (pFVar6->fadexpr_).expr_.dx_.num_elts;
  }
  if ((uVar4 == 0) || ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        vVar12 = FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar7);
        pdVar5[uVar7] = vVar12;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      pFVar6 = (fadexpr->fadexpr_).left_;
      dVar13 = (pFVar6->fadexpr_).expr_.dx_.ptr_to_data[uVar7];
      dVar8 = sin((pFVar6->fadexpr_).expr_.val_);
      dVar9 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
      pFVar3 = (fadexpr->fadexpr_).right_;
      dVar14 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data[uVar7];
      dVar10 = cos((pFVar3->fadexpr_).expr_.val_);
      dVar11 = cos((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
      pdVar5[uVar7] = dVar11 * dVar10 * dVar14 - dVar9 * dVar8 * dVar13;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
LAB_01427975:
  dVar13 = cos((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
  dVar14 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar14 * dVar13;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}